

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void push_symbol(Context_conflict *ctx,SymbolMap *map,char *sym,MOJOSHADER_astDataType *dt,int index
                ,int check_dupes)

{
  int iVar1;
  SymbolScope *pSVar2;
  void *value;
  SymbolScope *local_38;
  
  if (ctx->out_of_memory != 0) {
    return;
  }
  local_38 = (SymbolScope *)0x0;
  if ((sym != (char *)0x0 && check_dupes != 0) &&
     (iVar1 = hash_find(map->hash,sym,&local_38), iVar1 != 0)) {
    for (pSVar2 = map->scope; (pSVar2 != (SymbolScope *)0x0 && (pSVar2->symbol != (char *)0x0));
        pSVar2 = pSVar2->next) {
      if (pSVar2 == local_38) {
        failf(ctx,"Symbol \'%s\' already defined",sym);
        return;
      }
    }
  }
  pSVar2 = (SymbolScope *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pSVar2 == (SymbolScope *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else if ((sym == (char *)0x0) || (iVar1 = hash_insert(map->hash,sym,pSVar2), iVar1 != -1)) {
    pSVar2->symbol = sym;
    pSVar2->index = index;
    pSVar2->datatype = dt;
    pSVar2->referenced = 0;
    pSVar2->next = map->scope;
    map->scope = pSVar2;
  }
  else {
    (*ctx->free)(pSVar2,ctx->malloc_data);
  }
  return;
}

Assistant:

static void push_symbol(Context *ctx, SymbolMap *map, const char *sym,
                        const MOJOSHADER_astDataType *dt, const int index,
                        const int check_dupes)
{
    if (ctx->out_of_memory)
        return;

    // Decide if this symbol is defined, and if it's in the current scope.
    SymbolScope *item = NULL;
    const void *value = NULL;
    if ((check_dupes) && (sym != NULL) && (hash_find(map->hash, sym, &value)))
    {
        // check the current scope for a dupe.
        // !!! FIXME: note current scope's starting index, see if found
        // !!! FIXME:  item is < index (and thus, a previous scope).
        item = map->scope;
        while ((item) && (item->symbol))
        {
            if ( ((const void *) item) == value )
            {
                failf(ctx, "Symbol '%s' already defined", sym);
                return;
            } // if
            item = item->next;
        } // while
    } // if

    // Add the symbol to our map and scope stack.
    item = (SymbolScope *) Malloc(ctx, sizeof (SymbolScope));
    if (item == NULL)
        return;

    if (sym != NULL)  // sym can be NULL if we're pushing a new scope.
    {
        if (hash_insert(map->hash, sym, item) == -1)
        {
            Free(ctx, item);
            return;
        } // if
    } // if

    item->symbol = sym;  // cached strings, don't copy.
    item->index = index;
    item->datatype = dt;
    item->referenced = 0;
    item->next = map->scope;
    map->scope = item;
}